

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_leaf.hpp
# Opt level: O2

bool __thiscall
duckdb::BaseLeaf<(unsigned_char)'\x0f',_(duckdb::NType)9>::GetNextByte
          (BaseLeaf<(unsigned_char)__x0f_,_(duckdb::NType)9> *this,uint8_t *byte)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  
  bVar1 = this->count;
  uVar2 = 0;
  do {
    uVar3 = uVar2;
    if (bVar1 == uVar3) goto LAB_01a2478b;
    uVar2 = uVar3 + 1;
  } while (this->key[uVar3] < *byte);
  *byte = this->key[uVar3];
LAB_01a2478b:
  return uVar3 < bVar1;
}

Assistant:

bool GetNextByte(uint8_t &byte) const {
		for (uint8_t i = 0; i < count; i++) {
			if (key[i] >= byte) {
				byte = key[i];
				return true;
			}
		}
		return false;
	}